

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O2

Stats * __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:198:29)>_>
::run(Stats *__return_storage_ptr__,
     Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:198:29)>_>
     *this,PathList *pathList,Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results,
     size_t depth)

{
  Results *pRVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  bool bVar4;
  value_type *top;
  pointer pSVar5;
  pointer pSVar6;
  uint64_t uVar7;
  size_t sVar8;
  string *psVar9;
  ulong uVar10;
  uint64_t uVar11;
  allocator local_451;
  int local_450;
  float result_a;
  float result_d;
  float result_c;
  float result_b;
  float result_a_1;
  uint64_t local_438;
  uint64_t uStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_420;
  size_type local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_400;
  size_type local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3e0;
  size_type local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  string local_3a0;
  ContextResultsRecorder *local_380;
  string *local_378;
  Stats *local_370;
  NameStack *local_368;
  Finally local_360;
  Finally stack;
  Finally stack_1;
  string local_330;
  undefined1 local_310 [16];
  uint64_t uStack_300;
  undefined1 local_2f8 [16];
  uint64_t local_2e8;
  WhenRunner local_2e0;
  StackElement local_248;
  StackElement local_238;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>
  local_228;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::Literal<int>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>
  local_118;
  string local_50;
  
  psVar9 = &this->name;
  pRVar1 = ((results.value)->results_).value;
  local_368 = &(results.value)->contextStack_;
  (*pRVar1->_vptr_Results[5])(pRVar1,local_368,psVar9);
  __return_storage_ptr__->checks_ = 0;
  __return_storage_ptr__->failedTests_ = 0;
  __return_storage_ptr__->fixtures_ = 0;
  __return_storage_ptr__->tests_ = 0;
  __return_storage_ptr__->failedChecks_ = 0;
  bVar4 = included(this,pathList,depth);
  if (bVar4) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)psVar9);
    WhenRunner::WhenRunner(&local_2e0,results,&local_50);
    local_380 = results.value;
    local_378 = psVar9;
    local_370 = __return_storage_ptr__;
    ::std::__cxx11::string::~string((string *)&local_50);
    if (local_2e0.whenStack.
        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_2e0.whenStack.
        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_2e0.whenStack.
      super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2e0.whenStack.
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    local_2e0.whenDepth_ = 0;
    pSVar5 = local_2e0.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = local_2e0.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2e0.stats_.fixtures_ = local_2e0.stats_.fixtures_ + 1;
    do {
      for (; pSVar6 != pSVar5; pSVar6 = pSVar6 + 1) {
        pSVar6->current = 0;
      }
      local_310._0_8_ = &local_2e0;
      local_2f8 = (undefined1  [16])0x0;
      stack0xfffffffffffffcf8 = (undefined1  [16])0x0;
      local_2e8 = 0;
      ::std::__cxx11::string::string
                ((string *)&local_3c0,"at least of them one is a zero vector",&local_451);
      uVar2 = local_310._0_8_;
      local_418 = local_3b8;
      local_420 = &local_410;
      if (local_3c0 == &local_3b0) {
        local_410._8_8_ = local_3b0._8_8_;
      }
      else {
        local_420 = local_3c0;
      }
      local_410._M_allocated_capacity._1_7_ = local_3b0._M_allocated_capacity._1_7_;
      local_410._M_local_buf[0] = local_3b0._M_local_buf[0];
      local_3b8 = 0;
      local_3b0._M_local_buf[0] = '\0';
      pSVar5 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                  *)(local_310._0_8_ + 0x30))->
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = *(size_t *)(local_310._0_8_ + 0x90);
      local_3c0 = &local_3b0;
      if ((ulong)((long)(((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                           *)(local_310._0_8_ + 0x30))->
                        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 4) <= uVar10)
      {
        local_248.index = 0;
        local_248.current = 0;
        std::
        vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ::emplace_back<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                  ((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                    *)(local_310._0_8_ + 0x30),&local_248);
        pSVar5 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                    *)(uVar2 + 0x30))->
                 super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = *(size_t *)(uVar2 + 0x90);
      }
      stack.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      *(undefined ***)
       stack.functor._M_t.
       super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       ._M_t.
       super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           &PTR__BaseFunctor_001794a8;
      *(undefined8 *)
       ((long)stack.functor._M_t.
              super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              ._M_t.
              super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
              _M_head_impl + 8) = uVar2;
      stack.valid = true;
      if (pSVar5[uVar10].index == pSVar5[uVar10].current) {
        *(ulong *)(uVar2 + 0x90) = uVar10 + 1;
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        if (local_420 == &local_410) {
          local_3a0.field_2._8_8_ = local_410._8_8_;
        }
        else {
          local_3a0._M_dataplus._M_p = (pointer)local_420;
        }
        local_3a0.field_2._M_allocated_capacity = local_410._M_allocated_capacity;
        local_3a0._M_string_length = local_418;
        local_418 = 0;
        local_410._M_allocated_capacity = local_410._M_allocated_capacity & 0xffffffffffffff00;
        local_420 = &local_410;
        WhenResultRecorder::push((WhenResultRecorder *)(uVar2 + 0x48),&local_3a0);
        ::std::__cxx11::string::~string((string *)&local_3a0);
        local_360.functor._M_t.
        super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        ._M_t.
        super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
              )operator_new(0x10);
        *(undefined ***)
         local_360.functor._M_t.
         super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         ._M_t.
         super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             &PTR__BaseFunctor_001794e8;
        ((BaseFunctor *)
        ((long)local_360.functor._M_t.
               super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               ._M_t.
               super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
               _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)uVar2;
        local_360.valid = true;
        result_a = 0.0;
        local_450 = 0;
        local_118.lhs.operatorName = "&&";
        local_118.lhs.lhs.operatorName = "&&";
        local_118.lhs.lhs.lhs.operatorName = "==";
        local_118.lhs.lhs.lhs.lhs.variableName = "result_a";
        local_118.lhs.lhs.lhs.lhs.value = &result_a;
        local_118.lhs.lhs.lhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_118.lhs.lhs.lhs.lhs.line = 0xd3;
        local_118.lhs.lhs.lhs.rhs.value = &local_450;
        local_118.lhs.lhs.rhs.variableName = "result_b == 0";
        local_118.lhs.lhs.rhs.value = true;
        local_118.lhs.lhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_118.lhs.lhs.rhs.line = 0xd3;
        local_118.lhs.rhs.variableName = "result_c == 0";
        local_118.lhs.rhs.value = true;
        local_118.lhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_118.lhs.rhs.line = 0xd4;
        local_118.rhs.variableName = "result_d == 0";
        local_118.rhs.value = true;
        local_118.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_118.rhs.line = 0xd4;
        local_118.operatorName = "&&";
        Check::
        operator()<const_char_(&)[22],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::Literal<int>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>_>
                  ((Check *)local_310,(char (*) [22])"cross product is zero",&local_118);
        Enhedron::Impl::Util::Finally::~Finally(&local_360);
      }
      Enhedron::Impl::Util::Finally::~Finally(&stack);
      ::std::__cxx11::string::~string((string *)&local_420);
      ::std::__cxx11::string::~string((string *)&local_3c0);
      ::std::__cxx11::string::string
                ((string *)&local_3e0,"other things happen",(allocator *)&local_420);
      uVar2 = local_310._0_8_;
      local_3f8 = local_3d8;
      local_400 = &local_3f0;
      if (local_3e0 == &local_3d0) {
        local_3f0._8_8_ = local_3d0._8_8_;
      }
      else {
        local_400 = local_3e0;
      }
      local_3f0._M_allocated_capacity._1_7_ = local_3d0._M_allocated_capacity._1_7_;
      local_3f0._M_local_buf[0] = local_3d0._M_local_buf[0];
      local_3d8 = 0;
      local_3d0._M_local_buf[0] = '\0';
      pSVar5 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                  *)(local_310._0_8_ + 0x30))->
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = *(size_t *)(local_310._0_8_ + 0x90);
      local_3e0 = &local_3d0;
      if ((ulong)((long)(((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                           *)(local_310._0_8_ + 0x30))->
                        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 4) <= uVar10)
      {
        local_238.index = 0;
        local_238.current = 0;
        std::
        vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ::emplace_back<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                  ((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                    *)(local_310._0_8_ + 0x30),&local_238);
        pSVar5 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                    *)(uVar2 + 0x30))->
                 super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = *(size_t *)(uVar2 + 0x90);
      }
      stack_1.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      *(undefined ***)
       stack_1.functor._M_t.
       super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       ._M_t.
       super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           &PTR__BaseFunctor_00179528;
      *(undefined8 *)
       ((long)stack_1.functor._M_t.
              super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              ._M_t.
              super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
              _M_head_impl + 8) = uVar2;
      stack_1.valid = true;
      if (pSVar5[uVar10].index == pSVar5[uVar10].current) {
        *(ulong *)(uVar2 + 0x90) = uVar10 + 1;
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        if (local_400 == &local_3f0) {
          local_330.field_2._8_8_ = local_3f0._8_8_;
        }
        else {
          local_330._M_dataplus._M_p = (pointer)local_400;
        }
        local_330.field_2._M_allocated_capacity = local_3f0._M_allocated_capacity;
        local_330._M_string_length = local_3f8;
        local_3f8 = 0;
        local_3f0._M_allocated_capacity = local_3f0._M_allocated_capacity & 0xffffffffffffff00;
        local_400 = &local_3f0;
        WhenResultRecorder::push((WhenResultRecorder *)(uVar2 + 0x48),&local_330);
        ::std::__cxx11::string::~string((string *)&local_330);
        local_3a0._M_dataplus._M_p = (pointer)operator_new(0x10);
        *(undefined ***)local_3a0._M_dataplus._M_p = &PTR__BaseFunctor_00179568;
        *(undefined8 *)(local_3a0._M_dataplus._M_p + 8) = uVar2;
        local_3a0._M_string_length = CONCAT71(local_3a0._M_string_length._1_7_,1);
        result_a_1 = 0.0;
        result_b = 0.0;
        result_c = 60.0;
        result_d = 0.0;
        local_228.lhs.operatorName = "&&";
        local_228.lhs.lhs.operatorName = "==";
        local_228.lhs.lhs.lhs.variableName = "result_a";
        local_228.lhs.lhs.lhs.value = &result_a_1;
        local_228.lhs.lhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.lhs.lhs.lhs.line = 0xe0;
        local_228.lhs.lhs.rhs.variableName = "result_d";
        local_228.lhs.lhs.rhs.value = &result_d;
        local_228.lhs.lhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.lhs.lhs.rhs.line = 0xe0;
        local_228.lhs.rhs.operatorName = "==";
        local_228.lhs.rhs.lhs.variableName = "result_c";
        local_228.lhs.rhs.lhs.value = &result_c;
        local_228.lhs.rhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.lhs.rhs.lhs.line = 0xe1;
        local_228.lhs.rhs.rhs.variableName = "-result_e";
        local_228.lhs.rhs.rhs.value = 60.0;
        local_228.lhs.rhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.lhs.rhs.rhs.line = 0xe1;
        local_228.rhs.operatorName = "==";
        local_228.rhs.lhs.variableName = "result_b";
        local_228.rhs.lhs.value = &result_b;
        local_228.rhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.rhs.lhs.line = 0xe2;
        local_228.rhs.rhs.variableName = "-result_a";
        local_228.rhs.rhs.value = -0.0;
        local_228.rhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.rhs.rhs.line = 0xe2;
        local_228.operatorName = "&&";
        Check::
        operator()<const_char_(&)[29],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>_>
                  ((Check *)local_310,(char (*) [29])"it yields the correct result",&local_228);
        Enhedron::Impl::Util::Finally::~Finally((Finally *)&local_3a0);
      }
      Enhedron::Impl::Util::Finally::~Finally(&stack_1);
      ::std::__cxx11::string::~string((string *)&local_400);
      ::std::__cxx11::string::~string((string *)&local_3e0);
      results.value = local_380;
      pSVar6 = local_2e0.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        local_2e0.whenStack.
        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar6;
        pSVar6 = local_2e0.whenStack.
                 super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        pSVar5 = local_2e0.whenStack.
                 super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_2e0.whenStack.
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_2e0.whenStack.
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_start) goto LAB_00145301;
        sVar8 = pSVar6->index + 1;
      } while (local_2e0.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].current == sVar8);
      pSVar6->index = sVar8;
      pSVar5 = local_2e0.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
LAB_00145301:
      uVar11 = local_2e0.stats_.fixtures_ + local_310._8_8_;
      local_2e0.stats_.tests_ = local_2e0.stats_.tests_ + 1 + uStack_300;
      uVar7 = local_2e0.stats_.failedChecks_ + local_2e8;
      local_438 = local_2e0.stats_.checks_ + local_2f8._0_8_;
      uStack_430 = local_2e0.stats_.failedTests_ + local_2f8._8_8_;
      pSVar6 = local_2e0.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2e0.stats_.fixtures_ = uVar11;
      local_2e0.stats_.checks_ = local_438;
      local_2e0.stats_.failedTests_ = uStack_430;
      local_2e0.stats_.failedChecks_ = uVar7;
    } while (local_2e0.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_2e0.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_start);
    if (local_2e0.stats_.tests_ == 0) {
      local_2e0.stats_.tests_ = 1;
    }
    uVar3 = local_2e0.stats_.tests_;
    WhenRunner::~WhenRunner(&local_2e0);
    local_370->fixtures_ = local_370->fixtures_ + uVar11;
    local_370->tests_ = local_370->tests_ + uVar3;
    local_370->checks_ = local_370->checks_ + local_438;
    local_370->failedTests_ = local_370->failedTests_ + uStack_430;
    local_370->failedChecks_ = local_370->failedChecks_ + uVar7;
    psVar9 = local_378;
    __return_storage_ptr__ = local_370;
  }
  pRVar1 = ((results.value)->results_).value;
  (*pRVar1->_vptr_Results[6])(pRVar1,__return_storage_ptr__,local_368,psVar9);
  return __return_storage_ptr__;
}

Assistant:

virtual Stats run(const PathList& pathList, Out<ContextResultsRecorder> results, size_t depth) override {
            results->beginGiven(name);
            Stats stats;

            if (included(pathList, depth)) {
                stats += args.applyExtraBefore(runTest, name, results);
            }

            results->endGiven(stats, name);

            return stats;
        }